

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O2

void __thiscall hmi::window::set_title(window *this,string_view title)

{
  string title_string;
  allocator<char> local_41;
  undefined8 local_40 [4];
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = title._M_str;
  local_20._M_len = title._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_40,&local_20,&local_41);
  SDL_SetWindowTitle(this->m_window,local_40[0]);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void window::set_title(std::string_view title) {
    std::string title_string(title);
    SDL_SetWindowTitle(m_window, title_string.data());
  }